

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O1

type LBFGS(Mesh *mesh,VectorXd *x,double *error)

{
  XprTypeNested *ppMVar1;
  double *pdVar2;
  undefined *puVar3;
  XprTypeNested pMVar4;
  double *pdVar5;
  double dVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Scalar SVar10;
  Scalar SVar11;
  double dVar12;
  XprType XVar13;
  undefined1 auVar14 [12];
  XprType XVar15;
  undefined1 auVar16 [8];
  undefined8 uVar17;
  PolyConnectivity *pPVar18;
  XprType *pXVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  undefined8 uVar23;
  long *plVar24;
  _IOManager_ *this;
  undefined **ppuVar25;
  ostream *poVar26;
  undefined8 *puVar27;
  double *in_RCX;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar28;
  double *pdVar29;
  ulong uVar30;
  ulong uVar31;
  Index extraout_RDX;
  uint uVar32;
  long lVar33;
  uint uVar34;
  ActualDstType actualDst;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pPVar35;
  XprType *pXVar36;
  double dVar37;
  uint uVar38;
  IO *this_00;
  long lVar39;
  ActualDstType actualDst_2;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_01;
  ActualDstType actualDst_1;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double dVar42;
  type tVar43;
  undefined1 auVar44 [12];
  VectorXd r;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
  __begin2;
  VertexHandle handles [10];
  VectorXd gradx;
  VectorXd q;
  VectorXd gradx0;
  double epsilon;
  VectorXd ys [7];
  VectorXd ss [7];
  double rhos [7];
  Mesh omesh;
  double alphas [7];
  undefined4 local_4ac;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_4a8;
  undefined1 local_498 [16];
  Matrix<double,__1,_1,_0,__1,_1> local_488;
  undefined1 local_478 [8];
  XprType *pXStack_470;
  double local_468;
  XprType *pXStack_460;
  undefined8 local_458;
  XprType *local_450;
  ulong local_440;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  DenseStorage<double,__1,__1,_1,_0> local_418;
  XprType local_408;
  Scalar local_3f8;
  PolyConnectivity *local_3f0;
  DenseStorage<double,__1,__1,_1,_0> local_3e8;
  double local_3d8 [2];
  Mesh *local_3c8;
  ulong local_3c0;
  double local_3b8;
  double *local_3b0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_3a8;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  double *local_348 [2];
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_338;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  pointer local_308;
  pointer pAStack_300;
  pointer local_2f8;
  pointer ppStack_2f0;
  pointer local_2e8;
  pointer ppStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  double adStack_2c8 [7];
  undefined1 local_290 [16];
  XprType *local_280;
  XprType *local_278;
  vector<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_> local_1c8 [8];
  iterator local_1c0;
  Vertex *local_1b8;
  BaseHandle local_f0;
  double adStack_68 [7];
  
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_2e8 = (pointer)0x0;
  ppStack_2e0 = (pointer)0x0;
  local_2f8 = (pointer)0x0;
  ppStack_2f0 = (pointer)0x0;
  local_308 = (pointer)0x0;
  pAStack_300 = (pointer)0x0;
  local_318 = 0;
  uStack_310 = 0;
  local_328 = 0;
  uStack_320 = 0;
  local_338.m_storage.m_data = (double *)0x0;
  local_338.m_storage.m_rows = 0;
  local_348[0] = (double *)0x0;
  local_348[1] = (double *)0x0;
  local_358 = 0;
  uStack_350 = 0;
  local_368 = 0;
  uStack_360 = 0;
  local_378 = 0;
  uStack_370 = 0;
  local_388 = 0;
  uStack_380 = 0;
  local_398 = 0;
  uStack_390 = 0;
  local_3a8.m_storage.m_data = (double *)0x0;
  local_3a8.m_storage.m_rows = 0;
  local_3c8 = mesh;
  local_3b0 = in_RCX;
  local_3b8 = getAveLen((Mesh *)x,(VectorXd *)error);
  local_3b8 = local_3b8 * 0.25;
  calcGrad((Mesh *)local_438,x,local_3b8);
  uVar30 = 0;
  local_3f0 = (PolyConnectivity *)x;
  do {
    local_440 = uVar30;
    OpenMesh::
    AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    ::AttribKernelT((AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                     *)local_290);
    local_290._0_8_ = &PTR__PolyConnectivity_001b2228;
    if (0 < (long)error[1]) {
      lVar33 = 0;
      do {
        local_428 = *(undefined1 (*) [16])((long)*error + lVar33 * 8);
        local_478._0_4_ = 0xffffffff;
        if (local_1c0._M_current == local_1b8) {
          std::vector<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>::
          _M_realloc_insert<OpenMesh::ArrayItems::Vertex>(local_1c8,local_1c0,(Vertex *)local_478);
        }
        else {
          ((local_1c0._M_current)->halfedge_handle_).super_BaseHandle.idx_ = -1;
          local_1c0._M_current = local_1c0._M_current + 1;
        }
        uVar23 = (*(code *)(((XprTypeNested)(local_290._0_8_ + 0x10))->
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                           .m_data)(local_290);
        pXVar19 = local_278;
        for (pXVar36 = local_280; pXVar36 != pXVar19; pXVar36 = (XprType *)&pXVar36->field_0x8) {
          pMVar4 = pXVar36->m_xpr;
          if (pMVar4 != (XprTypeNested)0x0) {
            (*(code *)(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data[3])(pMVar4,uVar23);
          }
        }
        iVar20 = OpenMesh::ArrayKernel::handle((ArrayKernel *)local_290,local_1c0._M_current + -1);
        pdVar29 = (&local_280->m_xpr)[local_f0.idx_][3].
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        *(ulong *)((long)pdVar29 + (long)iVar20 * 0xc) =
             CONCAT44((float)(double)local_428._8_8_,(float)(double)local_428._0_8_);
        *(undefined4 *)((long)pdVar29 + (long)iVar20 * 0xc + 8) = 0;
        lVar33 = lVar33 + 2;
      } while (lVar33 < (long)error[1]);
    }
    pPVar18 = local_3f0;
    local_498 = OpenMesh::PolyConnectivity::faces_begin(local_3f0);
    auVar44 = OpenMesh::PolyConnectivity::faces_end(pPVar18);
    auVar14 = local_498._0_12_;
    iVar20 = local_498._8_4_;
    while (auVar44 != auVar14) {
      local_468 = -NAN;
      pXStack_460 = (XprType *)0xffffffffffffffff;
      local_478 = (undefined1  [8])0xffffffffffffffff;
      pXStack_470 = (XprType *)0xffffffffffffffff;
      local_458 = 0xffffffffffffffff;
      uVar32 = *(uint *)(*(long *)&pPVar18->field_0xf8 + (long)iVar20 * 4);
      if ((int)uVar32 < 0) {
        uVar30 = 0;
      }
      else {
        lVar33 = *(long *)&pPVar18->field_0xe0;
        uVar30 = 0;
        uVar38 = 0;
        uVar34 = uVar32;
        do {
          do {
            lVar39 = (long)((int)uVar34 >> 1) * 0x20 + lVar33;
            uVar31 = (ulong)((uVar34 & 1) << 4);
            *(undefined4 *)(local_478 + uVar30 * 4) = *(undefined4 *)(uVar31 + 4 + lVar39);
            uVar30 = uVar30 + 1;
            uVar34 = *(uint *)(uVar31 + 8 + lVar39);
            uVar38 = uVar38 + (uVar34 == uVar32);
          } while (uVar34 != uVar32);
        } while (uVar38 != ~uVar32 >> 0x1f);
        uVar30 = uVar30 & 0xffffffff;
      }
      OpenMesh::PolyConnectivity::add_face
                ((PolyConnectivity *)local_290,(VertexHandle *)local_478,uVar30);
      local_498._8_4_ = local_498._8_4_ + 1;
      if (local_498._12_4_ != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    *)local_498);
      }
      XVar13._8_8_ = local_498._8_8_;
      XVar13.m_xpr = (XprTypeNested)local_498._0_8_;
      auVar14._8_4_ = local_498._8_4_;
      auVar14._0_8_ = local_498._0_8_;
      iVar20 = local_498._8_4_;
      local_498 = (undefined1  [16])XVar13;
    }
    uVar32 = (uint)local_440;
    local_3c0 = local_440 & 0xffffffff;
    if ((uVar32 == 1) || (uVar32 + (int)(local_3c0 / 10) * -10 == 0)) {
      uVar34 = 1;
      if (9 < uVar32) {
        uVar38 = 4;
        uVar30 = local_440;
        do {
          uVar34 = uVar38;
          uVar21 = (uint)uVar30;
          if (uVar21 < 100) {
            uVar34 = uVar34 - 2;
            goto LAB_0013e445;
          }
          if (uVar21 < 1000) {
            uVar34 = uVar34 - 1;
            goto LAB_0013e445;
          }
          if (uVar21 < 10000) goto LAB_0013e445;
          uVar30 = (uVar30 & 0xffffffff) / 10000;
          uVar38 = uVar34 + 4;
        } while (99999 < uVar21);
        uVar34 = uVar34 + 1;
      }
LAB_0013e445:
      local_3e8.m_data = local_3d8;
      std::__cxx11::string::_M_construct((ulong)&local_3e8,(char)uVar34);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_3e8.m_data,uVar34,uVar32);
      plVar24 = (long *)std::__cxx11::string::append((char *)&local_3e8);
      pXVar36 = (XprType *)(plVar24 + 2);
      if ((XprType *)*plVar24 == pXVar36) {
        local_408.m_xpr = pXVar36->m_xpr;
        local_408._8_8_ = plVar24[3];
        local_418.m_data = (double *)&local_408;
      }
      else {
        local_408.m_xpr = pXVar36->m_xpr;
        local_418.m_data = (double *)*plVar24;
      }
      local_418.m_rows = plVar24[1];
      *plVar24 = (long)pXVar36;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      plVar24 = (long *)std::__cxx11::string::append((char *)&local_418);
      pMVar28 = (Matrix<double,__1,_1,_0,__1,_1> *)(plVar24 + 2);
      if ((Matrix<double,__1,_1,_0,__1,_1> *)*plVar24 == pMVar28) {
        local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (pMVar28->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
        local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             plVar24[3];
        local_498._0_8_ = &local_488;
      }
      else {
        local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (pMVar28->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
        local_498._0_8_ = (Matrix<double,__1,_1,_0,__1,_1> *)*plVar24;
      }
      local_498._8_8_ = plVar24[1];
      *plVar24 = (long)pMVar28;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      this_00 = (IO *)local_498;
      plVar24 = (long *)std::__cxx11::string::append((char *)this_00);
      pdVar29 = (double *)(plVar24 + 2);
      if ((double *)*plVar24 == pdVar29) {
        local_468 = *pdVar29;
        pXStack_460 = (XprType *)plVar24[3];
        local_478 = (undefined1  [8])&local_468;
      }
      else {
        local_468 = *pdVar29;
        local_478 = (undefined1  [8])*plVar24;
      }
      pXStack_470 = (XprType *)plVar24[1];
      *plVar24 = (long)pdVar29;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      local_4a8.m_storage.m_data = (double *)&PTR__BaseExporter_001b2970;
      local_4a8.m_storage.m_rows = (Index)local_290;
      this = (_IOManager_ *)OpenMesh::IO::IOManager(this_00);
      local_4ac = 0;
      OpenMesh::IO::_IOManager_::write
                (this,(string *)local_478,(BaseExporter *)&local_4a8,(Options)(value_type)&local_4ac
                 ,6);
      if (local_478 != (undefined1  [8])&local_468) {
        operator_delete((void *)local_478,(long)local_468 + 1);
      }
      uVar32 = (uint)local_440;
      if ((Matrix<double,__1,_1,_0,__1,_1> *)local_498._0_8_ != &local_488) {
        operator_delete((void *)local_498._0_8_,
                        (long)local_488.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + 1);
      }
      if ((XprType *)local_418.m_data != &local_408) {
        operator_delete(local_418.m_data,
                        (ulong)((long)&((local_408.m_xpr)->
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       ).m_storage.m_data + 1));
      }
      if (local_3e8.m_data != local_3d8) {
        operator_delete(local_3e8.m_data,(long)local_3d8[0] + 1);
      }
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              (&local_418,(DenseStorage<double,__1,__1,_1,_0> *)local_438);
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              (&local_3e8,(DenseStorage<double,__1,__1,_1,_0> *)local_438);
    pXVar36 = (XprType *)error[1];
    local_4a8.m_storage.m_data = (double *)0x0;
    local_4a8.m_storage.m_rows = 0;
    ppuVar25 = (undefined **)local_4a8.m_storage.m_data;
    if (pXVar36 != (XprType *)0x0) {
      free((void *)0x0);
      if (pXVar36 == (XprType *)0x0) {
        local_4a8.m_storage.m_data = (double *)0x0;
        ppuVar25 = (undefined **)local_4a8.m_storage.m_data;
      }
      else {
        if ((ulong)pXVar36 >> 0x3d != 0) {
LAB_0013f077:
          puVar27 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar27 = std::streambuf::xsgetn;
          __cxa_throw(puVar27,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        ppuVar25 = (undefined **)malloc((long)pXVar36 * 8);
        if (ppuVar25 == (undefined **)0x0) goto LAB_0013f077;
      }
    }
    local_4a8.m_storage.m_data = (double *)ppuVar25;
    uVar34 = 7;
    if (7 < (int)uVar32) {
      uVar34 = uVar32;
    }
    uVar34 = uVar34 - 7;
    iVar20 = uVar32 - 1;
    local_4a8.m_storage.m_rows = (Index)pXVar36;
    if (uVar34 < uVar32) {
      do {
        iVar22 = iVar20 % 7;
        local_498._8_8_ = &local_338 + iVar22;
        local_498._0_8_ = &local_418;
        if ((&local_338)[iVar22].m_storage.m_rows == 0) {
          uVar40 = 0;
          uVar41 = 0;
        }
        else {
          pXStack_470 = (XprType *)local_418.m_data;
          pXStack_460 = (XprType *)
                        (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                         local_498._8_8_)->m_storage).m_data;
          local_450 = (XprType *)local_498;
          SVar10 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_3,_0>
                   ::run((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          *)local_478,(scalar_sum_op<double,_double> *)&local_4ac);
          uVar40 = SUB84(SVar10,0);
          uVar41 = (undefined4)((ulong)SVar10 >> 0x20);
        }
        dVar42 = (double)CONCAT44(uVar41,uVar40) * adStack_2c8[iVar22];
        adStack_68[iVar22] = dVar42;
        pdVar29 = (&local_3a8)[iVar22].m_storage.m_data;
        pXVar36 = (XprType *)(local_418.m_rows - (local_418.m_rows >> 0x3f) & 0xfffffffffffffffe);
        if (1 < local_418.m_rows) {
          lVar33 = 0;
          do {
            pdVar5 = pdVar29 + lVar33;
            dVar6 = pdVar5[1];
            dVar37 = (double)((XprTypeNested *)local_418.m_data + lVar33)[1];
            ((XprTypeNested *)local_418.m_data)[lVar33] =
                 (XprTypeNested)
                 ((double)((XprTypeNested *)local_418.m_data)[lVar33] - *pdVar5 * dVar42);
            ((XprTypeNested *)local_418.m_data + lVar33)[1] =
                 (XprTypeNested)(dVar37 - dVar6 * dVar42);
            lVar33 = lVar33 + 2;
          } while (lVar33 < (long)pXVar36);
        }
        if ((long)pXVar36 < local_418.m_rows) {
          do {
            ((XprTypeNested *)local_418.m_data)[(long)pXVar36] =
                 (XprTypeNested)
                 ((double)((XprTypeNested *)local_418.m_data)[(long)pXVar36] -
                 pdVar29[(long)pXVar36] * dVar42);
            pXVar36 = (XprType *)((long)&pXVar36->m_xpr + 1);
          } while ((XprType *)local_418.m_rows != pXVar36);
        }
        bVar7 = (int)uVar34 < iVar20;
        iVar20 = iVar20 + -1;
      } while (bVar7);
    }
    pdVar29 = local_418.m_data;
    uVar38 = (uint)local_440;
    if (uVar38 == 0) {
      if (local_4a8.m_storage.m_rows != local_418.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_4a8,local_418.m_rows,1);
      }
      pXVar36 = (XprType *)
                (local_4a8.m_storage.m_rows - (local_4a8.m_storage.m_rows >> 0x3f) &
                0xfffffffffffffffe);
      if (1 < local_4a8.m_storage.m_rows) {
        lVar33 = 0;
        do {
          ppMVar1 = (XprTypeNested *)pdVar29 + lVar33;
          puVar3 = (undefined *)ppMVar1[1];
          local_4a8.m_storage.m_data[lVar33] = (double)*ppMVar1;
          (local_4a8.m_storage.m_data + lVar33)[1] = (double)puVar3;
          lVar33 = lVar33 + 2;
        } while (lVar33 < (long)pXVar36);
      }
      if ((long)pXVar36 < local_4a8.m_storage.m_rows) {
        do {
          local_4a8.m_storage.m_data[(long)pXVar36] =
               (double)((XprTypeNested *)pdVar29)[(long)pXVar36];
          pXVar36 = (XprType *)((long)&pXVar36->m_xpr + 1);
        } while ((XprType *)local_4a8.m_storage.m_rows != pXVar36);
      }
    }
    else {
      iVar20 = (int)(uVar32 - 1) % 7;
      local_498._0_8_ = &local_338 + iVar20;
      pPVar35 = &local_3a8 + iVar20;
      local_3f8 = 0.0;
      local_428 = ZEXT816(0);
      if ((&local_3a8)[iVar20].m_storage.m_rows != 0) {
        pXStack_470 = (XprType *)
                      (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_498._0_8_)
                      ->m_storage).m_data;
        pXStack_460 = (XprType *)(pPVar35->m_storage).m_data;
        local_450 = (XprType *)local_498;
        local_498._8_8_ = pPVar35;
        SVar10 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_3,_0>
                 ::run((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_478,(scalar_sum_op<double,_double> *)&local_4ac);
        local_428._8_4_ = extraout_XMM0_Dc;
        local_428._0_8_ = SVar10;
        local_428._12_4_ = extraout_XMM0_Dd;
      }
      local_498._0_8_ = pPVar35;
      local_498._8_8_ = pPVar35;
      if ((&local_3a8)[iVar20].m_storage.m_rows != 0) {
        pXStack_470 = (XprType *)(pPVar35->m_storage).m_data;
        local_450 = (XprType *)local_498;
        pXStack_460 = pXStack_470;
        local_3f8 = Eigen::internal::
                    redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_3,_0>
                    ::run((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)local_478,(scalar_sum_op<double,_double> *)&local_4ac);
      }
      pdVar29 = local_418.m_data;
      if (local_4a8.m_storage.m_rows != local_418.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_4a8,local_418.m_rows,1);
      }
      XVar15._8_8_ = local_498._8_8_;
      XVar15.m_xpr = (XprTypeNested)local_498._0_8_;
      uVar40 = local_428._12_4_;
      dVar42 = local_428._0_8_ / local_3f8;
      local_428._8_4_ = local_428._8_4_;
      local_428._0_8_ = dVar42;
      local_428._12_4_ = uVar40;
      pXVar36 = (XprType *)
                (local_4a8.m_storage.m_rows - (local_4a8.m_storage.m_rows >> 0x3f) &
                0xfffffffffffffffe);
      if (1 < local_4a8.m_storage.m_rows) {
        lVar33 = 0;
        do {
          ppMVar1 = (XprTypeNested *)pdVar29 + lVar33;
          dVar6 = (double)ppMVar1[1];
          local_4a8.m_storage.m_data[lVar33] = (double)((double)*ppMVar1 * dVar42);
          (local_4a8.m_storage.m_data + lVar33)[1] = (double)(dVar6 * dVar42);
          lVar33 = lVar33 + 2;
        } while (lVar33 < (long)pXVar36);
      }
      if ((long)pXVar36 < local_4a8.m_storage.m_rows) {
        do {
          local_4a8.m_storage.m_data[(long)pXVar36] =
               (double)((double)((XprTypeNested *)pdVar29)[(long)pXVar36] * dVar42);
          pXVar36 = (XprType *)((long)&pXVar36->m_xpr + 1);
          local_498 = (undefined1  [16])XVar15;
        } while ((XprType *)local_4a8.m_storage.m_rows != pXVar36);
      }
    }
    if (uVar34 < uVar38) {
      do {
        uVar32 = uVar34 % 7;
        dVar42 = adStack_2c8[uVar32];
        local_498._8_8_ = (long)&local_3a8.m_storage.m_data + (ulong)(uVar32 * 0x10);
        local_498._0_8_ = &local_4a8;
        if (*(long *)((long)&local_3a8.m_storage.m_rows + (ulong)(uVar32 * 0x10)) == 0) {
          uVar40 = 0;
          uVar41 = 0;
        }
        else {
          local_428._0_8_ = dVar42;
          pXStack_470 = (XprType *)local_4a8.m_storage.m_data;
          pXStack_460 = (XprType *)
                        (((RhsNested)local_498._8_8_)->
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                        m_data;
          local_450 = (XprType *)local_498;
          SVar10 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_3,_0>
                   ::run((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          *)local_478,(scalar_sum_op<double,_double> *)&local_4ac);
          uVar40 = SUB84(SVar10,0);
          uVar41 = (undefined4)((ulong)SVar10 >> 0x20);
          dVar42 = (double)local_428._0_8_;
        }
        dVar42 = adStack_68[uVar32] - dVar42 * (double)CONCAT44(uVar41,uVar40);
        pdVar29 = (&local_338)[uVar32].m_storage.m_data;
        pXVar36 = (XprType *)
                  (local_4a8.m_storage.m_rows - (local_4a8.m_storage.m_rows >> 0x3f) &
                  0xfffffffffffffffe);
        if (1 < local_4a8.m_storage.m_rows) {
          lVar33 = 0;
          do {
            pdVar5 = pdVar29 + lVar33;
            dVar6 = pdVar5[1];
            puVar3 = (undefined *)(local_4a8.m_storage.m_data + lVar33)[1];
            local_4a8.m_storage.m_data[lVar33] =
                 (double)(*pdVar5 * dVar42 + (double)local_4a8.m_storage.m_data[lVar33]);
            (local_4a8.m_storage.m_data + lVar33)[1] = (double)(dVar6 * dVar42 + (double)puVar3);
            lVar33 = lVar33 + 2;
          } while (lVar33 < (long)pXVar36);
        }
        if ((long)pXVar36 < local_4a8.m_storage.m_rows) {
          do {
            local_4a8.m_storage.m_data[(long)pXVar36] =
                 (double)(pdVar29[(long)pXVar36] * dVar42 +
                         (double)local_4a8.m_storage.m_data[(long)pXVar36]);
            pXVar36 = (XprType *)((long)&pXVar36->m_xpr + 1);
          } while ((XprType *)local_4a8.m_storage.m_rows != pXVar36);
        }
        uVar34 = uVar34 + 1;
      } while ((int)uVar34 < (int)uVar38);
    }
    local_478 = (undefined1  [8])0x0;
    pXStack_470 = (XprType *)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_478,
               local_4a8.m_storage.m_rows,1);
    pdVar29 = local_4a8.m_storage.m_data;
    if (pXStack_470 != (XprType *)local_4a8.m_storage.m_rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_478,
                 local_4a8.m_storage.m_rows,1);
    }
    pPVar18 = local_3f0;
    pXVar36 = (XprType *)((long)pXStack_470 - ((long)pXStack_470 >> 0x3f) & 0xfffffffffffffffe);
    if (1 < (long)pXStack_470) {
      lVar33 = 0;
      do {
        ppuVar25 = (undefined **)(pdVar29 + lVar33);
        uVar32 = *(uint *)((long)ppuVar25 + 4);
        puVar3 = ppuVar25[1];
        ppMVar1 = (XprTypeNested *)local_478 + lVar33;
        *(undefined4 *)ppMVar1 = *(undefined4 *)ppuVar25;
        *(uint *)((long)ppMVar1 + 4) = uVar32 ^ 0x80000000;
        *(int *)(ppMVar1 + 1) = (int)puVar3;
        *(uint *)((long)ppMVar1 + 0xc) = (uint)((ulong)puVar3 >> 0x20) ^ 0x80000000;
        lVar33 = lVar33 + 2;
      } while (lVar33 < (long)pXVar36);
    }
    if ((long)pXVar36 < (long)pXStack_470) {
      do {
        ppuVar25 = (undefined **)(pdVar29 + (long)pXVar36);
        uVar32 = *(uint *)((long)ppuVar25 + 4);
        *(undefined4 *)((XprTypeNested *)local_478 + (long)pXVar36) = *(undefined4 *)ppuVar25;
        *(uint *)((long)((XprTypeNested *)local_478 + (long)pXVar36) + 4) = uVar32 ^ 0x80000000;
        pXVar36 = (XprType *)((long)&pXVar36->m_xpr + 1);
      } while (pXStack_470 != pXVar36);
    }
    dVar42 = getStepLength((Mesh *)local_3f0,(VectorXd *)error,(VectorXd *)local_478,
                           (VectorXd *)&local_3e8,&local_3b8,
                           *(double *)(&DAT_0019b810 + (ulong)(uVar38 == 0) * 8));
    local_428._8_4_ = extraout_XMM0_Dc_00;
    local_428._0_8_ = dVar42;
    local_428._12_4_ = extraout_XMM0_Dd_00;
    free((void *)local_478);
    local_3f8 = local_3b8;
    getEnergy((Mesh *)pPVar18,(VectorXd *)error,local_3b8,true);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Step: ",6);
    poVar26 = (ostream *)std::ostream::operator<<(&std::cout,(int)local_440);
    std::__ostream_insert<char,std::char_traits<char>>(poVar26," Norm of Gradient: ",0x13);
    local_498._0_8_ = local_438;
    if ((XprType *)local_438._8_8_ == (XprType *)0x0) {
      uVar40 = 0;
      uVar41 = 0;
    }
    else {
      pXStack_470 = (XprType *)local_438._0_8_;
      pXStack_460 = (XprType *)local_498;
      SVar11 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_3,_0>
               ::run((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)local_478,(scalar_sum_op<double,_double> *)&local_4ac);
      uVar40 = SUB84(SVar11,0);
      uVar41 = (undefined4)((ulong)SVar11 >> 0x20);
    }
    poVar26 = std::ostream::_M_insert<double>(SQRT((double)CONCAT44(uVar41,uVar40)));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar26 + -0x18) + (char)poVar26);
    std::ostream::put((char)poVar26);
    std::ostream::flush();
    pdVar29 = local_4a8.m_storage.m_data;
    iVar20 = (int)(local_3c0 * 0x24924925 >> 0x20);
    uVar32 = (((uint)((int)local_440 - iVar20) >> 1) + iVar20 >> 2) * -7 + (int)local_440;
    uVar30 = (ulong)(uVar32 * 0x10);
    pPVar35 = (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              ((long)&local_338.m_storage.m_data + uVar30);
    if (*(XprType **)((long)&local_338.m_storage.m_rows + uVar30) !=
        (XprType *)local_4a8.m_storage.m_rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (pPVar35,local_4a8.m_storage.m_rows,1);
    }
    pdVar5 = (pPVar35->m_storage).m_data;
    uVar30 = *(ulong *)((long)&local_338.m_storage.m_rows + uVar30);
    uVar31 = uVar30 - ((long)uVar30 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar30) {
      lVar33 = 0;
      do {
        ppuVar25 = (undefined **)(pdVar29 + lVar33);
        puVar3 = ppuVar25[1];
        pdVar2 = pdVar5 + lVar33;
        *pdVar2 = -(double)*ppuVar25 * (double)local_428._0_8_;
        pdVar2[1] = -(double)puVar3 * (double)local_428._0_8_;
        lVar33 = lVar33 + 2;
      } while (lVar33 < (long)uVar31);
    }
    if ((long)uVar31 < (long)uVar30) {
      do {
        pdVar5[uVar31] = -(double)pdVar29[uVar31] * (double)local_428._0_8_;
        uVar31 = uVar31 + 1;
      } while (uVar30 != uVar31);
    }
    pdVar29 = (pPVar35->m_storage).m_data;
    dVar42 = *error;
    dVar6 = error[1];
    dVar37 = (double)((long)dVar6 - ((long)dVar6 >> 0x3f) & 0xfffffffffffffffe);
    if (1 < (long)dVar6) {
      lVar33 = 0;
      do {
        pdVar5 = pdVar29 + lVar33;
        pdVar2 = (double *)((long)dVar42 + lVar33 * 8);
        dVar12 = pdVar5[1] + pdVar2[1];
        auVar8._8_4_ = SUB84(dVar12,0);
        auVar8._0_8_ = *pdVar5 + *pdVar2;
        auVar8._12_4_ = (int)((ulong)dVar12 >> 0x20);
        *(undefined1 (*) [16])((long)dVar42 + lVar33 * 8) = auVar8;
        lVar33 = lVar33 + 2;
      } while (lVar33 < (long)dVar37);
    }
    if ((long)dVar37 < (long)dVar6) {
      do {
        *(double *)((long)dVar42 + (long)dVar37 * 8) =
             pdVar29[(long)dVar37] + *(double *)((long)dVar42 + (long)dVar37 * 8);
        dVar37 = (double)((long)dVar37 + 1);
      } while (dVar6 != dVar37);
    }
    calcGrad((Mesh *)local_478,(VectorXd *)local_3f0,local_3f8);
    uVar17 = local_438._8_8_;
    uVar23 = local_438._0_8_;
    auVar16 = local_478;
    local_478 = (undefined1  [8])local_438._0_8_;
    local_438._0_8_ = auVar16;
    local_438._8_8_ = pXStack_470;
    pXStack_470 = (XprType *)uVar17;
    free((void *)uVar23);
    pdVar29 = local_3e8.m_data;
    uVar23 = local_438._0_8_;
    this_01 = &local_3a8 + uVar32;
    if ((&local_3a8)[uVar32].m_storage.m_rows != local_3e8.m_rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (this_01,local_3e8.m_rows,1);
    }
    pdVar5 = (this_01->m_storage).m_data;
    uVar30 = (&local_3a8)[uVar32].m_storage.m_rows;
    uVar31 = uVar30 - ((long)uVar30 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar30) {
      lVar33 = 0;
      do {
        ppMVar1 = (XprTypeNested *)uVar23 + lVar33;
        pdVar2 = pdVar29 + lVar33;
        dVar42 = (double)ppMVar1[1] - pdVar2[1];
        auVar9._8_4_ = SUB84(dVar42,0);
        auVar9._0_8_ = (double)*ppMVar1 - *pdVar2;
        auVar9._12_4_ = (int)((ulong)dVar42 >> 0x20);
        *(undefined1 (*) [16])(pdVar5 + lVar33) = auVar9;
        lVar33 = lVar33 + 2;
      } while (lVar33 < (long)uVar31);
    }
    if ((long)uVar31 < (long)uVar30) {
      do {
        pdVar5[uVar31] = (double)((XprTypeNested *)uVar23)[uVar31] - pdVar29[uVar31];
        uVar31 = uVar31 + 1;
      } while (uVar30 != uVar31);
    }
    uVar40 = 0;
    uVar41 = 0;
    local_498._0_8_ = pPVar35;
    local_498._8_8_ = this_01;
    if ((&local_3a8)[uVar32].m_storage.m_rows != 0) {
      pXStack_470 = (XprType *)(pPVar35->m_storage).m_data;
      pXStack_460 = (XprType *)(this_01->m_storage).m_data;
      local_450 = (XprType *)local_498;
      SVar10 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_3,_0>
               ::run((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)local_478,(scalar_sum_op<double,_double> *)&local_4ac);
      uVar40 = SUB84(SVar10,0);
      uVar41 = (undefined4)((ulong)SVar10 >> 0x20);
    }
    adStack_2c8[uVar32] = 1.0 / (double)CONCAT44(uVar41,uVar40);
    free(local_4a8.m_storage.m_data);
    free(local_3e8.m_data);
    free(local_418.m_data);
    OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_290);
    uVar30 = local_440;
    local_478 = (undefined1  [8])local_438;
    uVar40 = 0;
    uVar41 = 0;
    if ((XprType *)local_438._8_8_ != (XprType *)0x0) {
      local_290._8_8_ = local_438._0_8_;
      local_278 = (XprType *)local_478;
      SVar11 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_3,_0>
               ::run((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)local_290,(scalar_sum_op<double,_double> *)local_498);
      uVar40 = SUB84(SVar11,0);
      uVar41 = (undefined4)((ulong)SVar11 >> 0x20);
    }
    uVar30 = (ulong)((int)uVar30 + 1);
    if (SQRT((double)CONCAT44(uVar41,uVar40)) < *local_3b0 ||
        SQRT((double)CONCAT44(uVar41,uVar40)) == *local_3b0) {
      *(double *)
       &(local_3c8->super_Mesh).
        super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
        .super_PolyConnectivity = *error;
      *(double *)
       &(local_3c8->super_Mesh).
        super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
        .super_PolyConnectivity.field_0x8 = error[1];
      *error = 0.0;
      error[1] = 0.0;
      free((void *)local_438._0_8_);
      lVar33 = 0x70;
      do {
        free(*(void **)((long)&local_3b8 + lVar33));
        lVar33 = lVar33 + -0x10;
      } while (lVar33 != 0);
      lVar33 = 0x70;
      do {
        free(*(void **)((long)local_348 + lVar33));
        lVar33 = lVar33 + -0x10;
      } while (lVar33 != 0);
      tVar43.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           extraout_RDX;
      tVar43.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)local_3c8;
      return (type)tVar43.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
    }
  } while( true );
}

Assistant:

auto LBFGS(Mesh& mesh, Eigen::VectorXd x, const double& error) {
    static constexpr int sz = 7;
    auto test = [&error](const Eigen::VectorXd& x) -> bool {
        return x.norm() > error;
    };

    Eigen::VectorXd ss[sz], ys[sz];
    double rhos[sz], alphas[sz];
    double epsilon = getAveLen(mesh, x) * 0.25f;
    Eigen::VectorXd gradx = calcGrad(mesh, x, epsilon);
    int k = 0;
    int step = 0;
    do{
        // Write intermediate result if test mode is enabled
        #ifdef TEST
            Mesh omesh;
            for (int i = 0; i < x.size(); i += 2) {
                OpenMesh::Vec3f vert(x[i], x[i + 1], 0.0f);
                omesh.add_vertex(vert);
            }
            for (auto face: mesh.all_faces()) {
                int cnt = 0;
                OpenMesh::VertexHandle handles[10];
                for (auto v: mesh.fv_range(face)) 
                    handles[cnt++] = v;
                omesh.add_face(handles, cnt);
            }
            if(k % 10 == 0 || k == 1)
                OpenMesh::IO::write_mesh(omesh, std::to_string(k) + "test" + "_param" +  ".obj");
        #endif
        auto q = gradx;
        auto gradx0 = gradx;
        Eigen::VectorXd r(x.size());
        for (int i = k - 1; i >= std::max(0, k - sz); --i) {
            alphas[i % sz] = q.dot(ss[i % sz]) * rhos[i % sz];
            q -= alphas[i % sz] * ys[i % sz]; 
        }
        if (k == 0)
            r = q;
        else r = ss[(k - 1) % sz].dot(ys[(k - 1) % sz]) / ys[(k - 1) % sz].dot(ys[(k - 1) % sz]) * q;
        for (int i = std::max(0, k - sz); i < k; ++i) {
            auto beta = rhos[i % sz] * r.dot(ys[i %sz]);
            r += ss[i % sz] * (alphas[i % sz] - beta);
        }
        double step_len = getStepLength(mesh, x, -r, gradx0, epsilon, k == 0 ? 1e-5 : 1.0);
        auto energy = getEnergy(mesh, x, epsilon, true);
        #ifdef TEST
            std::cout << "Step: " << step++ << " Norm of Gradient: "<< gradx.norm() << std::endl;
        #endif
        // update array for y, s, rho
        ss[k % sz] = step_len * -r;
        x += ss[k % sz];
        gradx = calcGrad(mesh, x, epsilon);
        ys[k % sz] = gradx - gradx0;
        rhos[k % sz] = 1.0 / ss[k % sz].dot(ys[k % sz]);
       
        ++k;
    }while(test(gradx));

    return std::move(x);
}